

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::Graph(Graph *this,int t,int q,string *f_file,string *q_file)

{
  string *q_file_local;
  string *f_file_local;
  int q_local;
  int t_local;
  Graph *this_local;
  
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&this->sequences);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->qualities);
  std::vector<Vertex,_std::allocator<Vertex>_>::vector(&this->vertices);
  this->treshhold = t;
  this->quality = q;
  readSequence(this);
  readQualities(this);
  createSubstrings(this);
  return;
}

Assistant:

Graph::Graph(int t, int q, string f_file, string q_file){
    this->treshhold = t;
    this->quality = q;
    this->readSequence();
    this->readQualities();
    this->createSubstrings();
}